

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O3

void math::internal::matrix_gk_svd<double>
               (double *mat_a,int rows,int cols,double *mat_u,double *vec_s,double *mat_v,
               double *epsilon)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  double *pdVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  void *pvVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  double *pdVar25;
  double *pdVar26;
  double *pdVar27;
  pointer pdVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  int i_1;
  ulong uVar33;
  double *pdVar34;
  uint uVar35;
  bool bVar36;
  undefined1 local_120 [8];
  vector<double,_std::allocator<double>_> buffer;
  vector<double,_std::allocator<double>_> mat_b33;
  allocator_type local_65;
  uint local_64;
  double *local_60;
  undefined8 local_58;
  ulong local_50;
  int local_44;
  double *local_40;
  ulong local_38;
  
  uVar35 = rows * rows;
  iVar18 = cols * rows;
  uVar3 = cols * cols;
  uVar23 = (ulong)uVar3;
  local_60 = mat_a;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_120,
             (long)(int)(uVar35 + (uVar3 + iVar18) * 2),
             (allocator_type *)
             &buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pdVar34 = local_60;
  local_58 = (double *)((long)local_120 + (ulong)uVar35 * 8);
  lVar6 = (long)iVar18;
  pdVar17 = local_58 + lVar6;
  local_60 = (double *)local_120;
  local_50 = (ulong)uVar35;
  matrix_bidiagonalize<double>(pdVar34,rows,cols,(double *)local_120,local_58,pdVar17,epsilon);
  pdVar34 = (double *)(ulong)(uint)cols;
  if (0 < rows) {
    pdVar10 = local_60 + uVar23 + lVar6 + local_50;
    uVar24 = 0;
    pdVar26 = local_60;
    do {
      if (0 < cols) {
        pdVar27 = (double *)0x0;
        do {
          pdVar10[(long)pdVar27] = pdVar26[(long)pdVar27];
          pdVar27 = (double *)((long)pdVar27 + 1);
        } while (pdVar34 != pdVar27);
      }
      uVar24 = uVar24 + 1;
      pdVar10 = pdVar10 + (long)pdVar34;
      pdVar26 = pdVar26 + (uint)rows;
    } while (uVar24 != (uint)rows);
  }
  if (cols != 0) {
    pdVar26 = pdVar17 + uVar23;
    pdVar10 = pdVar26 + lVar6;
    local_64 = rows;
    local_38 = (ulong)(uint)cols;
    memmove(pdVar10,local_58,uVar23 * 8);
    uVar24 = local_50;
    pdVar27 = local_60;
    if (0 < iVar18) {
      uVar35 = (uint)local_38;
      local_44 = uVar35 + 1;
      uVar7 = 1;
      if (1 < uVar3) {
        uVar7 = uVar23;
      }
      pdVar11 = local_60 + local_50 + uVar23 + lVar6 * 2 + 1;
      local_60 = (double *)(ulong)~uVar35;
      iVar31 = 0;
      do {
        local_40 = (double *)0x0;
        if ((int)local_38 != 0) {
          uVar8 = 0;
          do {
            dVar1 = pdVar27[uVar23 + uVar24 + lVar6 * 2 + uVar8];
            if ((0.0 - *epsilon <= dVar1) && (dVar1 <= *epsilon)) {
              pdVar27[uVar23 + uVar24 + lVar6 * 2 + uVar8] = 0.0;
            }
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
          if (1 < (int)local_38) {
            iVar4 = 0;
            uVar8 = 1;
            pdVar12 = pdVar11;
            pdVar25 = pdVar10;
            iVar14 = local_44;
            do {
              if (ABS(*pdVar12) <= ABS(pdVar25[iVar4] + pdVar10[iVar14]) * *epsilon) {
                *pdVar12 = 0.0;
              }
              pdVar25 = pdVar25 + 1;
              iVar4 = iVar4 + (int)local_38;
              pdVar12 = pdVar12 + (long)(int)uVar35 + 1;
              iVar14 = iVar14 + local_44;
              bVar36 = uVar8 != uVar35 - 1;
              uVar8 = uVar8 + 1;
            } while (bVar36);
          }
          local_40 = (double *)0x0;
          if (0 < (int)local_38) {
            lVar32 = 1;
            lVar20 = 8;
            local_40 = (double *)0x0;
            pdVar12 = (double *)0x0;
            local_50 = (ulong)(uVar3 - 1);
            do {
              pdVar25 = (double *)((long)pdVar12 + 1);
              local_58 = pdVar12;
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)
                         &buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)pdVar25 * (long)pdVar25,
                         &local_65);
              lVar15 = 0;
              uVar8 = local_50;
              pdVar28 = buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              do {
                lVar22 = 0;
                do {
                  pdVar28[lVar22] = pdVar10[(int)uVar8 + (int)lVar22];
                  lVar22 = lVar22 + 1;
                } while (lVar32 != lVar22);
                lVar15 = lVar15 + 1;
                pdVar28 = (pointer)((long)pdVar28 + lVar20);
                uVar8 = uVar8 + (long)pdVar34;
              } while (lVar15 != lVar32);
              iVar14 = (int)pdVar25;
              bVar36 = matrix_is_diagonal<double>
                                 (buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage,iVar14,iVar14,epsilon);
              if (bVar36) {
                pdVar12 = pdVar25;
                if (((long)local_58 < (long)(int)(uVar35 - 1)) &&
                   (bVar36 = matrix_is_submatrix_zero_enclosed<double>
                                       (pdVar10,(int)local_38,iVar14,epsilon), pdVar12 = local_40,
                   bVar36)) {
                  pdVar12 = pdVar25;
                }
                local_40 = (double *)((ulong)pdVar12 & 0xffffffff);
              }
              if (buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                operator_delete(buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
              }
              lVar32 = lVar32 + 1;
              lVar20 = lVar20 + 8;
              local_50 = local_50 + (long)local_60;
              pdVar12 = pdVar25;
            } while (pdVar25 != pdVar34);
          }
        }
        uVar19 = (int)local_38 - (int)local_40;
        pvVar9 = operator_new__((ulong)(uVar19 * uVar19) << 3);
        if ((int)uVar19 < 1) {
          local_58 = (double *)((ulong)local_58._4_4_ << 0x20);
        }
        else {
          dVar1 = *epsilon;
          local_50 = (ulong)uVar19;
          uVar16 = (ulong)(~(uint)local_40 + (int)local_38 * uVar19);
          lVar20 = 1;
          lVar32 = 8;
          lVar15 = 0x200000000;
          local_58 = (double *)((ulong)local_58._4_4_ << 0x20);
          uVar8 = 0;
          do {
            uVar29 = uVar8 + 1;
            lVar22 = 0;
            pvVar21 = pvVar9;
            uVar30 = uVar16;
            do {
              lVar13 = 0;
              do {
                *(double *)((long)pvVar21 + lVar13 * 8) = pdVar10[(int)uVar30 + (int)lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar20 != lVar13);
              lVar22 = lVar22 + 1;
              pvVar21 = (void *)((long)pvVar21 + lVar32);
              uVar30 = uVar30 + (long)pdVar34;
            } while (lVar22 != lVar20);
            if (uVar8 == 0) {
LAB_0010f826:
              local_58 = (double *)CONCAT44(local_58._4_4_,(int)uVar29);
            }
            else if ((0.0 < *(double *)((long)pvVar9 + 8) - dVar1) ||
                    (*(double *)((long)pvVar9 + 8) + dVar1 < 0.0)) {
              lVar22 = lVar15;
              uVar30 = 1;
              do {
                uVar33 = uVar30;
                if (uVar8 == uVar33) break;
                dVar2 = *(double *)((long)pvVar9 + (lVar22 >> 0x1d) + 8);
                lVar22 = lVar22 + lVar15;
                uVar30 = uVar33 + 1;
              } while ((0.0 < dVar2 - dVar1) || (dVar2 + dVar1 < 0.0));
              if (uVar8 <= uVar33) goto LAB_0010f826;
            }
            lVar20 = lVar20 + 1;
            lVar32 = lVar32 + 8;
            uVar16 = uVar16 + (long)local_60;
            lVar15 = lVar15 + 0x100000000;
            uVar8 = uVar29;
          } while (uVar29 != local_50);
        }
        operator_delete__(pvVar9);
        if ((int)local_38 == (int)local_40) break;
        iVar14 = uVar19 - (int)local_58;
        if (iVar14 < (int)(uVar19 - 1)) {
          iVar5 = local_44 * iVar14;
          iVar4 = (int)local_58;
          do {
            if ((0.0 - *epsilon <= pdVar10[iVar5]) && (pdVar10[iVar5] <= *epsilon)) {
              pdVar10[iVar5] = 0.0;
              matrix_svd_clear_super_entry<double>
                        (local_64,(int)local_38,pdVar10,pdVar26,uVar19 - iVar4,epsilon);
              goto LAB_0010f903;
            }
            iVar4 = iVar4 + -1;
            iVar5 = iVar5 + local_44;
          } while (iVar4 != 1);
        }
        matrix_gk_svd_step<double>
                  (local_64,(int)local_38,pdVar10,pdVar26,pdVar17,iVar14,(int)local_40,epsilon);
LAB_0010f903:
        iVar31 = iVar31 + 1;
      } while (iVar31 != iVar18);
    }
    if (local_64 != 0) {
      memmove(mat_u,pdVar26,lVar6 << 3);
    }
    iVar18 = (int)local_38;
    if ((iVar18 != 0) && (memmove(mat_v,pdVar17,uVar23 * 8), 0 < iVar18)) {
      iVar31 = 0;
      pdVar17 = (double *)0x0;
      do {
        vec_s[(long)pdVar17] = pdVar10[iVar31];
        pdVar17 = (double *)((long)pdVar17 + 1);
        iVar31 = iVar31 + iVar18 + 1;
      } while (pdVar34 != pdVar17);
      if (0 < (int)local_38) {
        pdVar17 = (double *)0x0;
        do {
          if ((vec_s[(long)pdVar17] < *epsilon) &&
             (vec_s[(long)pdVar17] = -vec_s[(long)pdVar17], uVar23 = (ulong)local_64,
             pdVar26 = mat_u, 0 < (int)local_64)) {
            do {
              *pdVar26 = -*pdVar26;
              uVar23 = uVar23 - 1;
              pdVar26 = pdVar26 + (long)pdVar34;
            } while (uVar23 != 0);
          }
          pdVar17 = (double *)((long)pdVar17 + 1);
          mat_u = mat_u + 1;
        } while (pdVar17 != pdVar34);
      }
    }
  }
  if (local_120 != (undefined1  [8])0x0) {
    operator_delete((void *)local_120);
  }
  return;
}

Assistant:

void
matrix_gk_svd (T const* mat_a, int rows, int cols,
    T* mat_u, T* vec_s, T* mat_v, T const& epsilon)
{
    /* Allocate memory for temp matrices. */
    int const mat_q_full_size = rows * rows;
    int const mat_b_full_size = rows * cols;
    int const mat_p_size = cols * cols;
    int const mat_q_size = rows * cols;
    int const mat_b_size = cols * cols;

    std::vector<T> buffer(mat_q_full_size + mat_b_full_size
        + mat_p_size + mat_q_size + mat_b_size);
    T* mat_q_full = &buffer[0];
    T* mat_b_full = mat_q_full + mat_q_full_size;
    T* mat_p = mat_b_full + mat_b_full_size;
    T* mat_q = mat_p + mat_p_size;
    T* mat_b = mat_q + mat_q_size;

    matrix_bidiagonalize(mat_a, rows, cols,
        mat_q_full, mat_b_full, mat_p, epsilon);

    /* Extract smaller matrices. */
    for (int i = 0; i < rows; ++i)
    {
        for (int j = 0; j < cols; ++j)
        {
            mat_q[i * cols + j] = mat_q_full[i * rows + j];
        }
    }
    std::copy(mat_b_full, mat_b_full + cols * cols, mat_b);

    /* Avoid infinite loops and exit after maximum number of iterations. */
    int const max_iterations = rows * cols;
    int iteration = 0;
    while (iteration < max_iterations)
    {
        iteration += 1;

        /* Enforce exact zeros for numerical stability. */
        for (int i = 0; i < cols * cols; ++i)
        {
            T const& entry = mat_b[i];
            if (MATH_EPSILON_EQ(entry, T(0), epsilon))
                mat_b[i] = T(0);
        }

        /* GK 2a. */
        for (int i = 0; i < (cols - 1); ++i)
        {
            if (std::abs(mat_b[i * cols + (i + 1)]) <= epsilon *
                std::abs(mat_b[i * cols + i] + mat_b[(i + 1) * cols + (i + 1)]))
            {
                mat_b[i * cols + (i + 1)] = T(0);
            }
        }

        /* GK 2b. */
        /* Select q such that b33 is diagonal and blocked by zeros. */
        int q = 0;
        for (int k = 0; k < cols; ++k)
        {
            int const slice_len = k + 1;
            std::vector<T> mat_b33(slice_len * slice_len);
            for (int i = 0; i < slice_len; ++i)
            {
                for (int j = 0; j < slice_len; ++j)
                {
                    mat_b33[i * slice_len + j]
                        = mat_b[(cols - k - 1 + i) * cols + (cols - k - 1 + j)];
                }
            }

            if (matrix_is_diagonal(&mat_b33[0], slice_len, slice_len, epsilon))
            {
                if (k < cols - 1)
                {
                    if (matrix_is_submatrix_zero_enclosed(
                        mat_b, cols, k + 1, epsilon))
                    {
                        q = k + 1;
                    }
                }
                else
                {
                    q = k + 1;
                }
            }
        }

        /* Select z := n-p-q such that B22 has no zero superdiagonal entry. */
        int z = 0;
        T* mat_b22_tmp = new T[(cols - q) * (cols - q)];
        for (int k = 0; k < (cols - q); ++k)
        {
            int const slice_len = k + 1;
            for (int i = 0; i < slice_len; ++i)
            {
                for (int j = 0; j < slice_len; ++j)
                {
                    mat_b22_tmp[i * slice_len + j]
                        = mat_b[(cols - q - k - 1 + i)
                        * cols + (cols - q - k - 1 + j)];
                }
            }
            if (matrix_is_superdiagonal_nonzero(
                mat_b22_tmp, slice_len, slice_len, epsilon))
            {
                z = k + 1;
            }
        }
        delete[] mat_b22_tmp;

        int const p = cols - q - z;

        /* GK 2c. */
        if (q == cols)
            break;

        bool diagonal_non_zero = true;
        int nz = 0;
        for (nz = p; nz < (cols - q - 1); ++nz)
        {
            if (MATH_EPSILON_EQ(mat_b[nz * cols + nz], T(0), epsilon))
            {
                diagonal_non_zero = false;
                mat_b[nz * cols + nz] = T(0);
                break;
            }
        }

        if (diagonal_non_zero)
            matrix_gk_svd_step(rows, cols, mat_b, mat_q, mat_p, p, q, epsilon);
        else
            matrix_svd_clear_super_entry(rows, cols, mat_b, mat_q, nz, epsilon);
    }

    /* Create resulting matrices and vector from temporary entities. */
    std::copy(mat_q, mat_q + rows * cols, mat_u);
    std::copy(mat_p, mat_p + cols * cols, mat_v);
    for (int i = 0; i < cols; ++i)
        vec_s[i] = mat_b[i * cols + i];

    /* Correct signs. */
    for (int i = 0; i < cols; ++i)
    {
        if (vec_s[i] < epsilon)
        {
            vec_s[i] = -vec_s[i];
            for (int j = 0; j < rows; ++j)
            {
                int index = j * cols + i;
                mat_u[index] = -mat_u[index];
            }
        }
    }
}